

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O2

void ffesum(unsigned_long sum,int complm,char *ascii)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  uint local_58;
  byte local_54 [12];
  char local_48 [24];
  int ch [4];
  char asc [32];
  
  uVar7 = 0xffffffff - sum;
  if (complm == 0) {
    uVar7 = sum;
  }
  pcVar5 = local_48;
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    uVar3 = ((&DAT_001fab90)[lVar6] & uVar7) >> ((char)lVar6 * -8 + 0x18U & 0x3f);
    uVar3 = (ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      *(int *)(local_54 + lVar4 * 4 + -4) = (int)((long)uVar3 / 4) + 0x30;
    }
    local_58 = local_58 + (int)((long)uVar3 % 4);
    iVar2 = 1;
    while (iVar2 != 0) {
      iVar2 = 0;
      for (lVar4 = 0; lVar4 != 0xd; lVar4 = lVar4 + 1) {
        uVar1 = (&DAT_001fab50)[lVar4];
        for (uVar3 = 0; uVar3 < 4; uVar3 = uVar3 + 2) {
          if (((*(uint *)(local_54 + uVar3 * 4 + -4) & 0xff) == uVar1) ||
             (local_54[uVar3 * 4] == uVar1)) {
            *(uint *)(local_54 + uVar3 * 4 + -4) = *(uint *)(local_54 + uVar3 * 4 + -4) + 1;
            *(int *)(local_54 + uVar3 * 4) = *(int *)(local_54 + uVar3 * 4) + -1;
            iVar2 = iVar2 + 1;
          }
        }
      }
    }
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      pcVar5[lVar4 * 4] = local_54[lVar4 * 4 + -4];
    }
    pcVar5 = pcVar5 + 1;
  }
  for (lVar6 = 0xf; lVar6 != 0x1f; lVar6 = lVar6 + 1) {
    ascii[lVar6 + -0xf] = local_48[(uint)lVar6 & 0xf];
  }
  ascii[0x10] = '\0';
  return;
}

Assistant:

void ffesum(unsigned long sum,  /* I - accumulated checksum                */
           int complm,          /* I - = 1 to encode complement of the sum */
           char *ascii)         /* O - 16-char ASCII encoded checksum      */
/*
    encode the 32 bit checksum by converting every 
    2 bits of each byte into an ASCII character (32 bit word encoded 
    as 16 character string).   Only ASCII letters and digits are used
    to encode the values (no ASCII punctuation characters).

    If complm=TRUE, then the complement of the sum will be encoded.

    This routine is based on the C algorithm developed by Rob
    Seaman at NOAO that was presented at the 1994 ADASS conference,
    published in the Astronomical Society of the Pacific Conference Series.
*/
{
    unsigned int exclude[13] = { 0x3a, 0x3b, 0x3c, 0x3d, 0x3e, 0x3f, 0x40,
                                       0x5b, 0x5c, 0x5d, 0x5e, 0x5f, 0x60 };
    unsigned long mask[4] = { 0xff000000, 0xff0000, 0xff00, 0xff  };

    int offset = 0x30;     /* ASCII 0 (zero) */

    unsigned long value;
    int byte, quotient, remainder, ch[4], check, ii, jj, kk;
    char asc[32];

    if (complm)
        value = 0xFFFFFFFF - sum;   /* complement each bit of the value */
    else
        value = sum;

    for (ii = 0; ii < 4; ii++)
    {
        byte = (value & mask[ii]) >> (24 - (8 * ii));
        quotient = byte / 4 + offset;
        remainder = byte % 4;
        for (jj = 0; jj < 4; jj++)
            ch[jj] = quotient;

        ch[0] += remainder;

        for (check = 1; check;)   /* avoid ASCII  punctuation */
            for (check = 0, kk = 0; kk < 13; kk++)
                for (jj = 0; jj < 4; jj += 2)
                    if ((unsigned char) ch[jj] == exclude[kk] ||
                        (unsigned char) ch[jj+1] == exclude[kk])
                    {
                        ch[jj]++;
                        ch[jj+1]--;
                        check++;
                    }

        for (jj = 0; jj < 4; jj++)        /* assign the bytes */
            asc[4*jj+ii] = ch[jj];
    }

    for (ii = 0; ii < 16; ii++)       /* shift the bytes 1 to the right */
        ascii[ii] = asc[(ii+15)%16];

    ascii[16] = '\0';
}